

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O1

void rlogin_free(Backend *be)

{
  Interactor *pIVar1;
  _Bool _Var2;
  
  _Var2 = is_tempseat((Seat *)be[-4].interactor);
  if (_Var2) {
    tempseat_free((Seat *)be[-4].interactor);
  }
  if (be[-1].vt != (BackendVtable *)0x0) {
    free_prompts((prompts_t *)be[-1].vt);
  }
  pIVar1 = be[-6].interactor;
  if (pIVar1 != (Interactor *)0x0) {
    (*pIVar1->vt->logpolicy)(pIVar1);
  }
  conf_free((Conf *)be[-2].interactor);
  safefree(be[-2].vt);
  safefree(&be[-6].interactor);
  return;
}

Assistant:

static void rlogin_free(Backend *be)
{
    Rlogin *rlogin = container_of(be, Rlogin, backend);

    if (is_tempseat(rlogin->seat))
        tempseat_free(rlogin->seat);
    if (rlogin->prompt)
        free_prompts(rlogin->prompt);
    if (rlogin->s)
        sk_close(rlogin->s);
    conf_free(rlogin->conf);
    sfree(rlogin->description);
    sfree(rlogin);
}